

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

SockaddrAny __thiscall
perfetto::base::anon_unknown_0::MakeSockAddr
          (anon_unknown_0 *this,SockFamily family,string *socket_name)

{
  pointer pcVar1;
  ulong __n;
  sockaddr *psVar2;
  code *pcVar3;
  pointer pbVar4;
  addrinfo *__ai;
  int iVar5;
  int *piVar6;
  void *pvVar7;
  char *pcVar8;
  uint *puVar9;
  char *pcVar10;
  undefined8 extraout_RAX;
  char cVar11;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar12;
  uint uVar13;
  pointer unaff_R15;
  SockaddrAny SVar14;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  sockaddr_un saddr;
  addrinfo *addr_info;
  addrinfo *addr_info_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  port;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f0;
  undefined1 local_d8 [32];
  char *local_b8;
  addrinfo *paStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined6 uStack_80;
  undefined2 local_7a;
  undefined6 uStack_78;
  undefined8 uStack_72;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  addrinfo *local_48;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_40;
  
  if (family == kInet6) {
    pcVar1 = local_d8 + 0x10;
    local_d8._0_8_ = pcVar1;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"]","");
    SplitString(&local_f0,socket_name,(string *)local_d8);
    if ((pointer)local_d8._0_8_ != pcVar1) {
      operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
    }
    pbVar4 = local_f0.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((long)local_f0.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_f0.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start != 0x40) {
      pcVar8 = Basename(
                       "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                       );
      puVar9 = (uint *)__errno_location();
      uVar13 = *puVar9;
      pcVar10 = strerror(uVar13);
      LogMessage(kLogError,pcVar8,0x106ef,"%s (errno: %d, %s)","PERFETTO_CHECK(parts.size() == 2)",
                 (ulong)uVar13,pcVar10);
LAB_002ede36:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    local_d8._0_8_ = pcVar1;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"[","");
    SplitString(&local_60,pbVar4,(string *)local_d8);
    if ((pointer)local_d8._0_8_ != pcVar1) {
      operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
    }
    if ((long)local_60.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_60.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start != 0x20) {
      pcVar8 = Basename(
                       "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                       );
      puVar9 = (uint *)__errno_location();
      uVar13 = *puVar9;
      pcVar10 = strerror(uVar13);
      LogMessage(kLogError,pcVar8,0x106f1,"%s (errno: %d, %s)","PERFETTO_CHECK(address.size() == 1)"
                 ,(ulong)uVar13,pcVar10);
      goto LAB_002ede36;
    }
    local_d8._0_8_ = pcVar1;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,":","");
    SplitString(&local_40,
                local_f0.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + 1,(string *)local_d8);
    if ((pointer)local_d8._0_8_ != pcVar1) {
      operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
    }
    if ((long)local_40.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_40.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start != 0x20) {
      pcVar8 = Basename(
                       "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                       );
      puVar9 = (uint *)__errno_location();
      uVar13 = *puVar9;
      pcVar10 = strerror(uVar13);
      LogMessage(kLogError,pcVar8,0x106f3,"%s (errno: %d, %s)","PERFETTO_CHECK(port.size() == 1)",
                 (ulong)uVar13,pcVar10);
      goto LAB_002ede36;
    }
    local_48 = (addrinfo *)0x0;
    local_d8._8_8_ = 0;
    local_b8 = (char *)0x0;
    paStack_b0 = (addrinfo *)0x0;
    local_d8._16_8_ = 0;
    local_d8._24_8_ = 0;
    local_d8._0_8_ = (pointer)0xa00000000;
    iVar5 = getaddrinfo(*(char **)local_60.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                        ((local_40.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,
                        (addrinfo *)local_d8,&local_48);
    __ai = local_48;
    if (iVar5 != 0) {
      pcVar8 = Basename(
                       "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                       );
      puVar9 = (uint *)__errno_location();
      uVar13 = *puVar9;
      pcVar10 = strerror(uVar13);
      LogMessage(kLogError,pcVar8,0x106f8,"%s (errno: %d, %s)",
                 "PERFETTO_CHECK(getaddrinfo(address[0].c_str(), port[0].c_str(), &hints, &addr_info) == 0)"
                 ,(ulong)uVar13,pcVar10);
      goto LAB_002ede36;
    }
    if (local_48->ai_family != 10) {
      pcVar8 = Basename(
                       "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                       );
      puVar9 = (uint *)__errno_location();
      uVar13 = *puVar9;
      pcVar10 = strerror(uVar13);
      LogMessage(kLogError,pcVar8,0x106f9,"%s (errno: %d, %s)",
                 "PERFETTO_CHECK(addr_info->ai_family == AF_INET6)",(ulong)uVar13,pcVar10);
      goto LAB_002ede36;
    }
    psVar2 = local_48->ai_addr;
    uVar13 = local_48->ai_addrlen;
    pvVar7 = operator_new__((ulong)uVar13);
    *(void **)this = pvVar7;
    *(uint *)(this + 8) = uVar13;
    memcpy(pvVar7,psVar2,(ulong)uVar13);
    freeaddrinfo(__ai);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_40);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_60);
  }
  else {
    if (family != kInet) {
      if (family != kUnix) {
        _GLOBAL__N_1::MakeSockAddr();
        if ((pointer)local_d8._0_8_ != unaff_R15) {
          operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_60);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_f0);
        _Unwind_Resume(extraout_RAX);
      }
      uStack_78 = 0;
      uStack_72 = 0;
      uStack_88 = 0;
      uStack_80 = 0;
      local_7a = 0;
      local_98 = 0;
      uStack_90 = 0;
      local_a8 = 0;
      uStack_a0 = 0;
      local_b8 = (char *)0x0;
      paStack_b0 = (addrinfo *)0x0;
      local_d8._16_8_ = 0;
      local_d8._24_8_ = 0;
      local_d8._0_8_ = (pointer)0x0;
      local_d8._8_8_ = 0;
      __n = socket_name->_M_string_length;
      if (__n < 0x6c) {
        memcpy(local_d8 + 2,(socket_name->_M_dataplus)._M_p,__n);
        cVar11 = '\0';
        if (local_d8[2] != '@') {
          cVar11 = local_d8[2];
        }
        local_d8[2] = cVar11;
        local_d8._0_2_ = 1;
        uVar13 = (int)__n + 3;
        pvVar7 = operator_new__((ulong)uVar13);
        *(void **)this = pvVar7;
        *(uint *)(this + 8) = uVar13;
        memcpy(pvVar7,local_d8,(ulong)uVar13);
        uVar12 = extraout_RDX_01;
      }
      else {
        piVar6 = __errno_location();
        *piVar6 = 0x24;
        *(undefined8 *)this = 0;
        *(undefined4 *)(this + 8) = 0;
        uVar12 = extraout_RDX;
      }
      goto LAB_002edbd3;
    }
    local_d8._0_8_ = local_d8 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,":","");
    SplitString(&local_f0,socket_name,(string *)local_d8);
    if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
      operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
    }
    if ((long)local_f0.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_f0.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start != 0x40) {
      pcVar8 = Basename(
                       "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                       );
      puVar9 = (uint *)__errno_location();
      uVar13 = *puVar9;
      pcVar10 = strerror(uVar13);
      LogMessage(kLogError,pcVar8,0x106e1,"%s (errno: %d, %s)","PERFETTO_CHECK(parts.size() == 2)",
                 (ulong)uVar13,pcVar10);
      goto LAB_002ede36;
    }
    local_60.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_d8._8_8_ = 0;
    local_b8 = (char *)0x0;
    paStack_b0 = (addrinfo *)0x0;
    local_d8._16_8_ = 0;
    local_d8._24_8_ = 0;
    local_d8._0_8_ = (pointer)0x200000000;
    iVar5 = getaddrinfo(((local_f0.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,
                        local_f0.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p,
                        (addrinfo *)local_d8,(addrinfo **)&local_60);
    pbVar4 = local_60.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (iVar5 != 0) {
      pcVar8 = Basename(
                       "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                       );
      puVar9 = (uint *)__errno_location();
      uVar13 = *puVar9;
      pcVar10 = strerror(uVar13);
      LogMessage(kLogError,pcVar8,0x106e6,"%s (errno: %d, %s)",
                 "PERFETTO_CHECK(getaddrinfo(parts[0].c_str(), parts[1].c_str(), &hints, &addr_info) == 0)"
                 ,(ulong)uVar13,pcVar10);
      goto LAB_002ede36;
    }
    if (*(int *)((long)local_60.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 4) != 2) {
      pcVar8 = Basename(
                       "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                       );
      puVar9 = (uint *)__errno_location();
      uVar13 = *puVar9;
      pcVar10 = strerror(uVar13);
      LogMessage(kLogError,pcVar8,0x106e7,"%s (errno: %d, %s)",
                 "PERFETTO_CHECK(addr_info->ai_family == AF_INET)",(ulong)uVar13,pcVar10);
      goto LAB_002ede36;
    }
    psVar2 = *(sockaddr **)
              ((long)local_60.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 0x18);
    uVar13 = *(uint *)&(local_60.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->field_2;
    pvVar7 = operator_new__((ulong)uVar13);
    *(void **)this = pvVar7;
    *(uint *)(this + 8) = uVar13;
    memcpy(pvVar7,psVar2,(ulong)uVar13);
    freeaddrinfo((addrinfo *)pbVar4);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_f0);
  uVar12 = extraout_RDX_00;
LAB_002edbd3:
  SVar14._8_8_ = uVar12;
  SVar14.data._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
  super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.super__Head_base<0UL,_char_*,_false>.
  _M_head_impl = (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)
                 (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)this;
  return SVar14;
}

Assistant:

SockaddrAny MakeSockAddr(SockFamily family, const std::string& socket_name) {
  switch (family) {
    case SockFamily::kUnix: {
      struct sockaddr_un saddr {};
      const size_t name_len = socket_name.size();
      if (name_len >= sizeof(saddr.sun_path)) {
        errno = ENAMETOOLONG;
        return SockaddrAny();
      }
      memcpy(saddr.sun_path, socket_name.data(), name_len);
      if (saddr.sun_path[0] == '@') {
        saddr.sun_path[0] = '\0';
#if PERFETTO_BUILDFLAG(PERFETTO_OS_WIN)
        // The MSDN blog claims that abstract (non-filesystem based) AF_UNIX
        // socket are supported, but that doesn't seem true.
        PERFETTO_ELOG(
            "Abstract AF_UNIX sockets are not supported on Windows, see "
            "https://github.com/microsoft/WSL/issues/4240");
        return SockaddrAny{};
#endif
      }
      saddr.sun_family = AF_UNIX;
      auto size = static_cast<socklen_t>(
          __builtin_offsetof(sockaddr_un, sun_path) + name_len + 1);
      PERFETTO_CHECK(static_cast<size_t>(size) <= sizeof(saddr));
      return SockaddrAny(&saddr, size);
    }
    case SockFamily::kInet: {
      auto parts = SplitString(socket_name, ":");
      PERFETTO_CHECK(parts.size() == 2);
      struct addrinfo* addr_info = nullptr;
      struct addrinfo hints {};
      hints.ai_family = AF_INET;
      PERFETTO_CHECK(getaddrinfo(parts[0].c_str(), parts[1].c_str(), &hints,
                                 &addr_info) == 0);
      PERFETTO_CHECK(addr_info->ai_family == AF_INET);
      SockaddrAny res(addr_info->ai_addr,
                      static_cast<socklen_t>(addr_info->ai_addrlen));
      freeaddrinfo(addr_info);
      return res;
    }
    case SockFamily::kInet6: {
      auto parts = SplitString(socket_name, "]");
      PERFETTO_CHECK(parts.size() == 2);
      auto address = SplitString(parts[0], "[");
      PERFETTO_CHECK(address.size() == 1);
      auto port = SplitString(parts[1], ":");
      PERFETTO_CHECK(port.size() == 1);
      struct addrinfo* addr_info = nullptr;
      struct addrinfo hints {};
      hints.ai_family = AF_INET6;
      PERFETTO_CHECK(getaddrinfo(address[0].c_str(), port[0].c_str(), &hints,
                                 &addr_info) == 0);
      PERFETTO_CHECK(addr_info->ai_family == AF_INET6);
      SockaddrAny res(addr_info->ai_addr,
                      static_cast<socklen_t>(addr_info->ai_addrlen));
      freeaddrinfo(addr_info);
      return res;
    }
  }
  PERFETTO_CHECK(false);  // For GCC.
}